

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawList::ChannelsMerge(ImDrawList *this)

{
  ImVector<unsigned_short> *pIVar1;
  ImDrawChannel *pIVar2;
  unsigned_short *__src;
  ImDrawCmd *__dest;
  unsigned_short *puVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  ImDrawCmd *pIVar11;
  int iVar12;
  
  if (1 < this->_ChannelsCount) {
    if ((long)this->_ChannelsCurrent != 0) {
      iVar8 = (this->CmdBuffer).Capacity;
      pIVar11 = (this->CmdBuffer).Data;
      pIVar2 = (this->_Channels).Data + this->_ChannelsCurrent;
      (pIVar2->CmdBuffer).Size = (this->CmdBuffer).Size;
      (pIVar2->CmdBuffer).Capacity = iVar8;
      (pIVar2->CmdBuffer).Data = pIVar11;
      iVar8 = (this->IdxBuffer).Capacity;
      puVar3 = (this->IdxBuffer).Data;
      pIVar1 = &(this->_Channels).Data[this->_ChannelsCurrent].IdxBuffer;
      pIVar1->Size = (this->IdxBuffer).Size;
      pIVar1->Capacity = iVar8;
      pIVar1->Data = puVar3;
      this->_ChannelsCurrent = 0;
      pIVar2 = (this->_Channels).Data;
      iVar8 = (pIVar2->CmdBuffer).Capacity;
      pIVar11 = (pIVar2->CmdBuffer).Data;
      (this->CmdBuffer).Size = (pIVar2->CmdBuffer).Size;
      (this->CmdBuffer).Capacity = iVar8;
      (this->CmdBuffer).Data = pIVar11;
      iVar8 = (pIVar2->IdxBuffer).Capacity;
      puVar3 = (pIVar2->IdxBuffer).Data;
      (this->IdxBuffer).Size = (pIVar2->IdxBuffer).Size;
      (this->IdxBuffer).Capacity = iVar8;
      (this->IdxBuffer).Data = puVar3;
      this->_IdxWritePtr = (this->IdxBuffer).Data + (this->IdxBuffer).Size;
    }
    iVar8 = (this->CmdBuffer).Size;
    iVar12 = 0;
    iVar7 = 0;
    if (((long)iVar8 != 0) &&
       (iVar7 = iVar8, (this->CmdBuffer).Data[(long)iVar8 + -1].ElemCount == 0)) {
      (this->CmdBuffer).Size = iVar8 + -1;
      iVar7 = iVar8 + -1;
    }
    iVar8 = this->_ChannelsCount;
    iVar6 = 0;
    if (1 < (long)iVar8) {
      pIVar2 = (this->_Channels).Data;
      iVar6 = 0;
      lVar5 = 0x20;
      iVar12 = 0;
      do {
        iVar7 = *(int *)((long)&(pIVar2->CmdBuffer).Size + lVar5);
        iVar9 = 0;
        if (((long)iVar7 != 0) &&
           (iVar9 = iVar7,
           *(int *)(*(long *)((long)&(pIVar2->CmdBuffer).Data + lVar5) + -0x30 + (long)iVar7 * 0x30)
           == 0)) {
          *(int *)((long)&(pIVar2->CmdBuffer).Size + lVar5) = iVar7 + -1;
          iVar9 = iVar7 + -1;
        }
        iVar6 = iVar6 + iVar9;
        iVar12 = iVar12 + *(int *)((long)&(pIVar2->IdxBuffer).Size + lVar5);
        lVar5 = lVar5 + 0x20;
      } while ((long)iVar8 * 0x20 != lVar5);
      iVar7 = (this->CmdBuffer).Size;
    }
    iVar7 = iVar7 + iVar6;
    iVar8 = (this->CmdBuffer).Capacity;
    if (iVar8 < iVar7) {
      if (iVar8 == 0) {
        iVar8 = 8;
      }
      else {
        iVar8 = iVar8 / 2 + iVar8;
      }
      if (iVar8 <= iVar7) {
        iVar8 = iVar7;
      }
      __dest = (ImDrawCmd *)ImGui::MemAlloc((long)iVar8 * 0x30);
      pIVar11 = (this->CmdBuffer).Data;
      if (pIVar11 != (ImDrawCmd *)0x0) {
        memcpy(__dest,pIVar11,(long)(this->CmdBuffer).Size * 0x30);
        ImGui::MemFree((this->CmdBuffer).Data);
      }
      (this->CmdBuffer).Data = __dest;
      (this->CmdBuffer).Capacity = iVar8;
    }
    (this->CmdBuffer).Size = iVar7;
    lVar5 = (long)(this->IdxBuffer).Size + (long)iVar12;
    iVar8 = (this->IdxBuffer).Capacity;
    iVar9 = (int)lVar5;
    if (iVar8 < iVar9) {
      if (iVar8 == 0) {
        iVar8 = 8;
      }
      else {
        iVar8 = iVar8 / 2 + iVar8;
      }
      if (iVar8 <= iVar9) {
        iVar8 = iVar9;
      }
      puVar3 = (unsigned_short *)ImGui::MemAlloc((long)iVar8 * 2);
      __src = (this->IdxBuffer).Data;
      if (__src != (unsigned_short *)0x0) {
        memcpy(puVar3,__src,(long)(this->IdxBuffer).Size * 2);
        ImGui::MemFree((this->IdxBuffer).Data);
      }
      (this->IdxBuffer).Data = puVar3;
      (this->IdxBuffer).Capacity = iVar8;
      iVar7 = (this->CmdBuffer).Size;
    }
    else {
      puVar3 = (this->IdxBuffer).Data;
    }
    (this->IdxBuffer).Size = iVar9;
    pIVar11 = (this->CmdBuffer).Data;
    this->_IdxWritePtr = puVar3 + (lVar5 - iVar12);
    if (1 < this->_ChannelsCount) {
      pIVar11 = pIVar11 + ((long)iVar7 - (long)iVar6);
      lVar5 = 1;
      lVar10 = 0x38;
      do {
        pIVar2 = (this->_Channels).Data;
        lVar4 = (long)*(int *)((long)pIVar2 + lVar10 + -0x18);
        if (lVar4 != 0) {
          memcpy(pIVar11,*(void **)((long)pIVar2 + lVar10 + -0x10),lVar4 * 0x30);
          pIVar11 = pIVar11 + lVar4;
        }
        lVar4 = (long)*(int *)((long)pIVar2 + lVar10 + -8);
        if (lVar4 != 0) {
          memcpy(this->_IdxWritePtr,*(void **)((long)&(pIVar2->CmdBuffer).Size + lVar10),lVar4 * 2);
          this->_IdxWritePtr = this->_IdxWritePtr + lVar4;
        }
        lVar5 = lVar5 + 1;
        lVar10 = lVar10 + 0x20;
      } while (lVar5 < this->_ChannelsCount);
    }
    UpdateClipRect(this);
    this->_ChannelsCount = 1;
  }
  return;
}

Assistant:

void ImDrawList::ChannelsMerge()
{
    // Note that we never use or rely on channels.Size because it is merely a buffer that we never shrink back to 0 to keep all sub-buffers ready for use.
    if (_ChannelsCount <= 1)
        return;

    ChannelsSetCurrent(0);
    if (CmdBuffer.Size && CmdBuffer.back().ElemCount == 0)
        CmdBuffer.pop_back();

    int new_cmd_buffer_count = 0, new_idx_buffer_count = 0;
    for (int i = 1; i < _ChannelsCount; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (ch.CmdBuffer.Size && ch.CmdBuffer.back().ElemCount == 0)
            ch.CmdBuffer.pop_back();
        new_cmd_buffer_count += ch.CmdBuffer.Size;
        new_idx_buffer_count += ch.IdxBuffer.Size;
    }
    CmdBuffer.resize(CmdBuffer.Size + new_cmd_buffer_count);
    IdxBuffer.resize(IdxBuffer.Size + new_idx_buffer_count);

    ImDrawCmd* cmd_write = CmdBuffer.Data + CmdBuffer.Size - new_cmd_buffer_count;
    _IdxWritePtr = IdxBuffer.Data + IdxBuffer.Size - new_idx_buffer_count;
    for (int i = 1; i < _ChannelsCount; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (int sz = ch.CmdBuffer.Size) { memcpy(cmd_write, ch.CmdBuffer.Data, sz * sizeof(ImDrawCmd)); cmd_write += sz; }
        if (int sz = ch.IdxBuffer.Size) { memcpy(_IdxWritePtr, ch.IdxBuffer.Data, sz * sizeof(ImDrawIdx)); _IdxWritePtr += sz; }
    }
    UpdateClipRect(); // We call this instead of AddDrawCmd(), so that empty channels won't produce an extra draw call.
    _ChannelsCount = 1;
}